

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# erarules.cpp
# Opt level: O3

int32_t __thiscall icu_63::EraRules::getStartYear(EraRules *this,int32_t eraIdx,UErrorCode *status)

{
  int iVar1;
  int32_t iVar2;
  
  if (U_ZERO_ERROR < *status) {
    return 0x7fffffff;
  }
  if ((-1 < eraIdx) && (eraIdx < this->numEras)) {
    iVar1 = (this->startDates).super_LocalPointerBase<int>.ptr[(uint)eraIdx];
    iVar2 = -1;
    if (iVar1 != -0x7ffffeff) {
      iVar2 = iVar1 >> 0x10;
    }
    return iVar2;
  }
  *status = U_ILLEGAL_ARGUMENT_ERROR;
  return 0x7fffffff;
}

Assistant:

int32_t EraRules::getStartYear(int32_t eraIdx, UErrorCode& status) const {
    int year = MAX_INT32;   // bogus value
    if(U_FAILURE(status)) {
        return year;
    }
    if (eraIdx < 0 || eraIdx >= numEras) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return year;
    }
    int fields[3];
    decodeDate(startDates[eraIdx], fields);
    year = fields[0];

    return year;
}